

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

Image * vera::scale(Image *__return_storage_ptr__,Image *_image,int _width,int _height)

{
  uint uVar1;
  pointer pBVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  float in_XMM1_Db;
  float fVar11;
  float fVar12;
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> vPrecalcs;
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> hPrecalcs;
  ulong local_b8;
  float local_a8 [6];
  pointer local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  double local_68;
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> local_60;
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> local_48;
  
  iVar3 = (*_image->_vptr_Image[8])(_image);
  Image::Image(__return_storage_ptr__,_width,_height,iVar3);
  std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::vector
            (&local_48,(long)_width,(allocator_type *)&local_60);
  std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::vector
            (&local_60,(long)_height,(allocator_type *)local_a8);
  iVar3 = (*_image->_vptr_Image[6])(_image);
  ResampleBicubicPrecalc(&local_48,iVar3);
  iVar3 = (*_image->_vptr_Image[7])(_image);
  ResampleBicubicPrecalc(&local_60,iVar3);
  if (0 < _height) {
    local_88 = (ulong)(uint)_height;
    local_80 = (ulong)(uint)_width;
    local_b8 = 0;
    do {
      if (0 < _width) {
        local_90 = local_60.
                   super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
                   _M_impl.super__Vector_impl_data._M_start + local_b8;
        lVar5 = 0;
        uVar9 = 0;
        do {
          pBVar2 = local_48.
                   super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_a8[0] = 0.0;
          local_a8[1] = 0.0;
          local_a8[2] = 0.0;
          local_a8[3] = 0.0;
          lVar7 = -1;
          local_78 = lVar5;
          local_70 = uVar9;
          do {
            iVar3 = local_90->offset[lVar7 + 1];
            lVar8 = lVar7 + 1;
            lVar10 = 0;
            do {
              iVar4 = *(int *)((long)pBVar2->offset + lVar10 * 4 + lVar5);
              (*_image->_vptr_Image[6])(_image);
              local_68 = local_90->weight[lVar7 + 1] *
                         *(double *)((long)pBVar2->weight + lVar10 * 8 + lVar5);
              iVar4 = (*_image->_vptr_Image[0xe])(_image,(long)iVar4,(long)iVar3);
              (*_image->_vptr_Image[0x19])(_image,CONCAT44(extraout_var,iVar4));
              uVar9 = local_70;
              fVar11 = (float)local_68;
              fVar12 = (float)local_a8._0_8_;
              in_XMM1_Da = in_XMM1_Da * fVar11 + (float)local_a8._8_8_;
              in_XMM1_Db = in_XMM1_Db * fVar11 + SUB84(local_a8._8_8_,4);
              local_a8[1] = SUB84(local_a8._0_8_,4) + extraout_XMM0_Db * fVar11;
              local_a8[0] = fVar12 + extraout_XMM0_Da * fVar11;
              local_a8[3] = in_XMM1_Db;
              local_a8[2] = in_XMM1_Da;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            lVar7 = lVar8;
          } while (lVar8 != 3);
          uVar1 = __return_storage_ptr__->m_channels;
          uVar6 = 4;
          if ((int)uVar1 < 4) {
            uVar6 = (ulong)uVar1;
          }
          (*__return_storage_ptr__->_vptr_Image[0x12])
                    (__return_storage_ptr__,
                     ((long)__return_storage_ptr__->m_width * local_b8 + local_70) *
                     (long)(int)uVar1,local_a8,uVar6);
          uVar9 = uVar9 + 1;
          lVar5 = local_78 + 0x30;
        } while (uVar9 != local_80);
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 != local_88);
  }
  if (local_60.super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Image scale(const Image& _image, int _width, int _height) {
    Image out = Image(_width, _height, _image.getChannels());

     // Precalculate weights
    std::vector<BicubicPrecalc> hPrecalcs(_width);
    std::vector<BicubicPrecalc> vPrecalcs(_height);

    ResampleBicubicPrecalc(hPrecalcs, _image.getWidth());
    ResampleBicubicPrecalc(vPrecalcs, _image.getHeight());

    for (int dsty = 0; dsty < _height; dsty++ ) {
        // We need to calculate the source pixel to interpolate from - Y-axis
        const BicubicPrecalc& vPrecalc = vPrecalcs[dsty];

        for (int dstx = 0; dstx < _width; dstx++ ) {
            // X-axis of pixel to interpolate from
            const BicubicPrecalc& hPrecalc = hPrecalcs[dstx];

            // Sums for each color channel
            glm::vec4 sum = glm::vec4(0.0f);

            // Here we actually determine the RGBA values for the destination pixel
            for ( int k = -1; k <= 2; k++ ) {
                // Y offset
                const int y_offset = vPrecalc.offset[k + 1];

                // Loop across the X axis
                for ( int i = -1; i <= 2; i++ ) {
                    // X offset
                    const int x_offset = hPrecalc.offset[i + 1];

                    // Calculate the exact position where the source data
                    // should be pulled from based on the x_offset and y_offset
                    int src_pixel_index = y_offset * _image.getWidth() + x_offset;

                    // Calculate the weight for the specified pixel according
                    // to the bicubic b-spline kernel we're using for
                    // interpolation
                    const float pixel_weight = vPrecalc.weight[k + 1] * hPrecalc.weight[i + 1];
                    sum += _image.getColor( _image.getIndex(x_offset, y_offset) ) * pixel_weight;
                }
            }
            out.setColor(out.getIndex(dstx, dsty), sum);
        }
    }
    return out;
}